

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_uncomp_copy(aec_stream_conflict *strm)

{
  uint32_t uVar1;
  uint uVar2;
  long in_RDI;
  internal_state_conflict *state;
  aec_stream_conflict *strm_00;
  
  strm_00 = *(aec_stream_conflict **)(in_RDI + 0x40);
  do {
    uVar1 = copysample(strm_00);
    if (uVar1 == 0) {
      return 0;
    }
    uVar2 = strm_00->rsi - 1;
    strm_00->rsi = uVar2;
  } while (uVar2 != 0);
  strm_00->next_in = (uchar *)m_id;
  return 1;
}

Assistant:

static int m_uncomp_copy(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    do {
        if (copysample(strm) == 0)
            return M_EXIT;
    } while(--state->i);

    state->mode = m_id;
    return M_CONTINUE;
}